

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.c
# Opt level: O2

void draw_statuses(nh_player_info *pi,nh_bool threeline)

{
  long lVar1;
  int iVar2;
  attr_t aVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  char (*__s) [12];
  
  if (statuswin == (WINDOW *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = (long)statuswin->_maxx + 2;
  }
  lVar7 = 0;
  do {
    if (player.nr_items <= lVar7) {
      return;
    }
    __s = player.statusitems + lVar7;
    sVar4 = strlen(*__s);
    uVar6 = (long)(int)uVar6 + ~sVar4;
    lVar1 = 0;
    do {
      lVar5 = lVar1;
      if (lVar5 + 0x10 == 0x220) {
        iVar2 = 0xf;
        goto LAB_00116a66;
      }
      iVar2 = strcmp(*__s,*(char **)((long)&statuscolors[0].name + lVar5));
      lVar1 = lVar5 + 0x10;
    } while (iVar2 != 0);
    iVar2 = *(int *)((long)&statuscolors[0].color + lVar5);
LAB_00116a66:
    aVar3 = curses_color_attr(iVar2,0);
    wmove(statuswin,2 - (uint)((char)pi == '\0'),uVar6 & 0xffffffff);
    wattr_on(statuswin,aVar3,0);
    wprintw(statuswin,"%s",__s);
    wattr_off(statuswin,aVar3,0);
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

static void draw_statuses(const struct nh_player_info *pi, nh_bool threeline)
{
    int i, j, k;

    j = getmaxx(statuswin) + 1;
    for (i = 0; i < pi->nr_items; i++) {
	attr_t colorattr;
	int color = CLR_WHITE;
	j -= strlen(pi->statusitems[i]) + 1;
	for (k = 0; statuscolors[k].name; k++) {
	    if (!strcmp(pi->statusitems[i], statuscolors[k].name)) {
		color = statuscolors[k].color;
		break;
	    }
	}
	colorattr = curses_color_attr(color, 0);
	wmove(statuswin, (threeline ? 2 : 1), j);
	wattron(statuswin, colorattr);
	wprintw(statuswin, "%s", pi->statusitems[i]);
	wattroff(statuswin, colorattr);
    }
}